

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O1

bool __thiscall Satyricon::SATSolver::solve(SATSolver *this)

{
  uint uVar1;
  pointer pLVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  SATSolver *pSVar7;
  long lVar8;
  long lVar9;
  long *plVar10;
  ClausePtr conflict;
  ostream *poVar11;
  vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *out_learnt;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  Literal l;
  int backtrack_level;
  uint local_70;
  int local_68;
  Literal local_64;
  ulong local_60;
  string local_58;
  vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *local_38;
  
  pSVar7 = this;
  if (0 < this->log_level) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"begin solve",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    pSVar7 = (SATSolver *)std::ostream::put(-0x28);
    std::ostream::flush();
  }
  lVar8 = (long)(this->clauses).
                super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->clauses).
                super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  lVar9 = lVar8 >> 3;
  auVar15._8_4_ = (int)(lVar8 >> 0x23);
  auVar15._0_8_ = lVar9;
  auVar15._12_4_ = 0x45300000;
  uVar13 = (ulong)(((auVar15._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) *
                  (this->param).initial_learn_mult);
  uVar12 = (this->param).restart_interval_multiplier;
  uVar5 = this->luby_next;
  this->luby_next = uVar5 + 1;
  uVar5 = next_restart_interval(pSVar7,uVar5);
  (this->param).restart_threshold = uVar5 * uVar12;
  Literal_Heap::initialize(&(this->order).order);
  local_70 = 0;
  print_status(this,0,0,(uint)uVar13);
  out_learnt = &this->solve_conflict_literals;
  local_60 = 100;
  local_68 = 100;
  uVar12 = 0;
  bVar4 = false;
  local_38 = out_learnt;
  do {
    if (1 < this->log_level) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"propagate at level ",0x13);
      plVar10 = (long *)std::ostream::operator<<
                                  (&std::cout,
                                   (int)((ulong)((long)(this->trail_limit).
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(this->trail_limit).
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start) >> 2
                                        ));
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
      std::ostream::put((char)plVar10);
      std::ostream::flush();
    }
    pSVar7 = this;
    conflict = propagation(this);
    uVar5 = (uint)uVar13;
    if (conflict == (ClausePtr)0x0) {
      if ((long)(this->trail).
                super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->trail).
                super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 != (ulong)this->number_of_variable) {
        if (((this->param).enable_deletion == true) &&
           ((uVar13 & 0xffffffff) <=
            (ulong)((long)(this->learned).
                          super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->learned).
                          super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3))) {
          pSVar7 = this;
          reduce_learned(this);
        }
        uVar5 = (this->param).restart_threshold;
        if ((uVar5 <= uVar12 & (this->param).enable_restart) == 1) {
          uVar6 = this->luby_next;
          uVar1 = (this->param).restart_interval_multiplier;
          this->luby_next = uVar6 + 1;
          uVar6 = next_restart_interval(pSVar7,uVar6);
          (this->param).restart_threshold = uVar6 * uVar1 + uVar5;
          if (1 < this->log_level) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"restarting. next restart at ",0x1c);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
          }
          local_70 = local_70 + 1;
          cancel_until(this,0);
          out_learnt = local_38;
        }
        local_64 = choice_lit(this);
        if (1 < this->log_level) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"decide literal ",0xf);
          Literal::print_abi_cxx11_(&local_58,&local_64);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               (char *)CONCAT44(local_58._M_dataplus._M_p._4_4_,
                                                (int)local_58._M_dataplus._M_p),
                               local_58._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_58._M_dataplus._M_p._4_4_,(int)local_58._M_dataplus._M_p) !=
              &local_58.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_58._M_dataplus._M_p._4_4_,(int)local_58._M_dataplus._M_p)
                            ,local_58.field_2._M_allocated_capacity + 1);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
        }
        assume(this,local_64);
        goto LAB_00112068;
      }
      if (1 < this->log_level) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"assinged all literals without conflict",0x26);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
      }
      build_sat_proof(this);
      print_status(this,uVar12,local_70,uVar5);
      bVar4 = true;
      bVar3 = false;
    }
    else {
      uVar12 = uVar12 + 1;
      if ((int)((ulong)((long)(this->trail_limit).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->trail_limit).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2) == 0) {
        if (1 < this->log_level) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"conflict at level 0, build unsat proof",0x26);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
        }
        print_status(this,uVar12,local_70,uVar5);
        bVar3 = false;
        bVar4 = false;
      }
      else {
        local_68 = local_68 + -1;
        if (local_68 == 0) {
          uVar14 = (ulong)((double)(local_60 & 0xffffffff) * 1.5);
          uVar5 = (int)(long)(((double)(uVar13 & 0xffffffff) *
                              (this->param).percentual_learn_increase) / 100.0) + uVar5;
          uVar13 = (ulong)uVar5;
          print_status(this,uVar12,local_70,uVar5);
          local_68 = (int)uVar14;
          local_60 = uVar14;
        }
        pLVar2 = (this->solve_conflict_literals).
                 super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl
                 .super__Vector_impl_data._M_start;
        if ((this->solve_conflict_literals).
            super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
            super__Vector_impl_data._M_finish != pLVar2) {
          (this->solve_conflict_literals).
          super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = pLVar2;
        }
        conflict_analysis(this,conflict,out_learnt,(int *)&local_58);
        cancel_until(this,(int)local_58._M_dataplus._M_p);
        learn_clause(this,out_learnt);
        literals_activity_decay(this);
        clause_activity_decay(this);
LAB_00112068:
        bVar3 = true;
      }
    }
    if (!bVar3) {
      return bVar4;
    }
  } while( true );
}

Assistant:

bool SATSolver::solve() {
    // main method
    PRINT("begin solve" << endl);

    // initialize search parameter
    unsigned int conflict_counter = 0;
    unsigned int restart_counter = 0;
    unsigned int learn_limit = static_cast<unsigned int>(
            static_cast<double>(clauses.size())*param.initial_learn_mult );
    param.restart_threshold = new_restart_threshold();

    unsigned int increase_limit_threshold = 100;
    unsigned int increase_limit_counter = increase_limit_threshold;

    // order literal for decision
    order.initialize_heap();

    // preprocess
    if ( param.enable_preprocessing) { preprocessing(); }

    print_status(conflict_counter,restart_counter, learn_limit);
    while ( true ) { // loop until a solution is found

        PRINT_VERBOSE("propagate at level " << current_level() << endl);
        // propagate assingment effect
        ClausePtr conflict = propagation();

        if ( conflict != nullptr ) {

            conflict_counter++;

            // if a conflict is found on level 0, it is impossible to solve
            // so the formula must be unsatisfiable
            if ( current_level() == 0 ) {
                PRINT_VERBOSE("conflict at level 0, build unsat proof" << endl);
                print_status(conflict_counter,restart_counter, learn_limit);
                return false; // UNSAT
            }

            if ( --increase_limit_counter == 0 ) {
                increase_limit_threshold *= 1.5;
                increase_limit_counter = increase_limit_threshold;
                learn_limit += static_cast<unsigned int>(
                        (learn_limit*param.percentual_learn_increase)/100.0);

                print_status(conflict_counter,restart_counter, learn_limit);
            }
            // otherwise, analize the conflict and backtrack

            int backtrack_level;
            solve_conflict_literals.clear();
            conflict_analysis(conflict,solve_conflict_literals,backtrack_level);

            cancel_until( backtrack_level );
            learn_clause(solve_conflict_literals); // learn the conflcit clause

            // after a conflict, the activity of literals and clauses decay
            literals_activity_decay();
            clause_activity_decay();
        }
        else {
            // no conflict and no more value to propagate

            // if all variables are asigned, the problem is satisfiable
            if ( number_of_assigned_variable() == number_of_variable ) {
                PRINT_VERBOSE("assinged all literals without conflict" << endl);
                build_sat_proof();
                print_status(conflict_counter,restart_counter, learn_limit);
                return true; // SAT
            }

            if ( current_level() == 0 ) {
                //simplify(clauses);
                //simplify(learned);
            }

            // if the learning limit is reached, the learned clause must
            // be reduced, the new learning limit is now higher
            if ( param.enable_deletion && learned.size() >= learn_limit ) {
                // cast for suppres warning
                reduce_learned();
            }

            if ( param.enable_restart &&
                    conflict_counter >= param.restart_threshold ) {
                // if the restart limit is reached, bactrack to level zero
                // and select the new threshold for the restart process
                restart_counter++;
                param.restart_threshold += new_restart_threshold();
                PRINT_VERBOSE("restarting. next restart at "<<
                        param.restart_threshold<< endl);
                cancel_until(0);
            }

            // open a new decision level and decide a new literal
            // based on the vsids heuristic
            Literal l = choice_lit();
            PRINT_VERBOSE("decide literal " << l << endl);
            assume(l);
        }
    }
}